

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O3

float __thiscall
anon_unknown.dwarf_5c268::MapDriver::scanObstacleMap
          (MapDriver *this,Vec3 *start,Vec3 *center,float arcAngle,int segments,
          float endRadiusChange,Color *beforeColor,Color *afterColor,Vec3 *returnObstaclePosition)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  Color *color;
  bool bVar8;
  int iVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_c0;
  float local_bc;
  float local_b8;
  Vec3 local_b0;
  Vec3 local_a0;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  Color *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Color *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar1 = start->x;
  uVar4 = start->y;
  uVar2 = center->x;
  uVar5 = center->y;
  fVar14 = (float)uVar1 - (float)uVar2;
  fVar15 = (float)uVar4 - (float)uVar5;
  local_bc = start->z - center->z;
  fVar11 = OpenSteer::Vec3::zero.y;
  returnObstaclePosition->x = OpenSteer::Vec3::zero.x;
  returnObstaclePosition->y = fVar11;
  returnObstaclePosition->z = OpenSteer::Vec3::zero.z;
  fVar11 = 0.0;
  local_c0 = 0.0;
  if ((endRadiusChange != 0.0) || (NAN(endRadiusChange))) {
    fVar11 = SQRT(local_bc * local_bc + fVar14 * fVar14 + fVar15 * fVar15);
  }
  local_78 = CONCAT44(fVar15,fVar14);
  uStack_70 = 0;
  local_b0.z = start->z;
  local_b0.x = start->x;
  local_b0.y = start->y;
  if (0 < segments) {
    local_8c = (float)segments;
    fVar14 = arcAngle / local_8c;
    fVar15 = fVar11 + endRadiusChange;
    if (fVar15 <= 0.0) {
      fVar15 = 0.0;
    }
    local_90 = fVar15 / fVar11 + -1.0;
    local_c0 = 0.0;
    local_b8 = 0.0;
    fVar11 = 0.0;
    iVar9 = 1;
    local_80 = beforeColor;
    local_60 = afterColor;
    bVar8 = false;
    do {
      if ((((local_b8 == 0.0) && (!NAN(local_b8))) && (fVar11 == 0.0)) && (!NAN(fVar11))) {
        local_b8 = sinf(fVar14);
        fVar11 = cosf(fVar14);
      }
      fVar15 = 1.0;
      if ((endRadiusChange != 0.0) || (NAN(endRadiusChange))) {
        fVar15 = ((float)iVar9 / local_8c) * local_90 + 1.0;
      }
      fVar16 = (float)local_78 * fVar11 + local_bc * local_b8;
      local_bc = local_bc * fVar11 - local_b8 * (float)local_78;
      uVar3 = center->x;
      uVar6 = center->y;
      fVar12 = (float)uVar3 + fVar15 * fVar16;
      fVar13 = (float)uVar6 + fVar15 * local_78._4_4_;
      local_a0.z = local_bc * fVar15 + center->z;
      local_a0.y = fVar13;
      local_a0.x = fVar12;
      bVar7 = true;
      color = local_60;
      local_84 = fVar11;
      if (bVar8 == false) {
        fStack_54 = local_78._4_4_;
        fStack_50 = (float)uStack_70;
        fStack_4c = uStack_70._4_4_;
        local_88 = local_a0.z;
        local_58 = fVar16;
        local_48 = fVar12;
        fStack_44 = fVar13;
        fStack_40 = fVar15 * (float)uStack_70 + 0.0;
        fStack_3c = fVar15 * uStack_70._4_4_ + 0.0;
        bVar7 = TerrainMap::getMapValue(this->map,&local_a0);
        if (bVar7) {
          fVar11 = SQRT((local_88 - local_b0.z) * (local_88 - local_b0.z) +
                        (local_48 - local_b0.x) * (local_48 - local_b0.x) +
                        (fStack_44 - local_b0.y) * (fStack_44 - local_b0.y));
          local_c0 = (float)iVar9 * (fVar11 + fVar11) * 0.5;
          returnObstaclePosition->x = local_48;
          returnObstaclePosition->y = fStack_44;
          returnObstaclePosition->z = local_88;
        }
        color = local_80;
        fVar16 = local_58;
      }
      local_78 = CONCAT44(local_78._4_4_,fVar16);
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,&local_b0,&local_a0,color);
      local_b0.x = local_a0.x;
      local_b0.y = local_a0.y;
      local_b0.z = local_a0.z;
      bVar10 = iVar9 != segments;
      fVar11 = local_84;
      iVar9 = iVar9 + 1;
      bVar8 = bVar7;
    } while (bVar10);
  }
  return local_c0;
}

Assistant:

float scanObstacleMap (const Vec3& start,
                               const Vec3& center,
                               const float arcAngle,
                               const int segments,
                               const float endRadiusChange,
                               const Color& beforeColor,
                               const Color& afterColor,
                               Vec3& returnObstaclePosition)
        {
            // "spoke" is initially the vector from center to start,
            // which is then rotated step by step around center
            Vec3 spoke = start - center;
            // determine the angular step per segment
            const float step = arcAngle / segments;
            // store distance to, and position of first obstacle
            float obstacleDistance = 0;
            returnObstaclePosition = Vec3::zero;
            // for spiral "ramps" of changing radius
            const float startRadius = (endRadiusChange == 0) ? 0 : spoke.length(); 

            // traverse each segment along arc
            float sin=0, cos=0;
            Vec3 oldPoint = start;
            bool obstacleFound = false;
            for (int i = 0; i < segments; i++)
            {
                // rotate "spoke" to next step around circle
                // (sin and cos values get filled in on first call)
                spoke = spoke.rotateAboutGlobalY (step, sin, cos);

                // for spiral "ramps" of changing radius
                const float adjust = ((endRadiusChange == 0) ?
                                      1.0f :
                                      interpolate ((float)(i+1) / (float)segments,
                                                   1.0f,
                                                   (maxXXX (0,
                                                            (startRadius +
                                                             endRadiusChange))
                                                    / startRadius)));

                // construct new scan point: center point, offset by rotated
                // spoke (possibly adjusting the radius if endRadiusChange!=0)
                const Vec3 newPoint = center + (spoke * adjust);

                // once an obstacle if found "our work here is done" -- continue
                // to loop only for the sake of annotation (make that optional?)
                if (obstacleFound)
                {
                    annotationLine (oldPoint, newPoint, afterColor);
                }
                else
                {
                    // no obstacle found on this scan so far,
                    // scan map along current segment (a chord of the arc)
                    const Vec3 offset = newPoint - oldPoint;
                    const float d2 = offset.length() * 2;

                    // when obstacle found: set flag, save distance and position
                    if (! map->isPassable (newPoint))
                    {
                        obstacleFound = true;
                        obstacleDistance = d2 * 0.5f * (i+1);
                        returnObstaclePosition = newPoint;
                    }
                    annotationLine (oldPoint, newPoint, beforeColor);
                }
                // save new point for next time around loop
                oldPoint = newPoint;
            }
            // return distance to first obstacle (or zero if none found)
            return obstacleDistance;
        }